

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileLexer.c
# Opt level: O0

int cmListFileLexer_SetString(cmListFileLexer *lexer,char *text)

{
  size_t sVar1;
  char *pcVar2;
  bool bVar3;
  uint local_1c;
  int length;
  int result;
  char *text_local;
  cmListFileLexer *lexer_local;
  
  local_1c = 1;
  cmListFileLexerDestroy(lexer);
  if (text != (char *)0x0) {
    sVar1 = strlen(text);
    pcVar2 = (char *)malloc((long)((int)sVar1 + 1));
    lexer->string_buffer = pcVar2;
    bVar3 = lexer->string_buffer != (char *)0x0;
    if (bVar3) {
      strcpy(lexer->string_buffer,text);
      lexer->string_position = lexer->string_buffer;
      lexer->string_left = (int)sVar1;
    }
    local_1c = (uint)bVar3;
  }
  cmListFileLexerInit(lexer);
  return local_1c;
}

Assistant:

int cmListFileLexer_SetString(cmListFileLexer* lexer, const char* text)
{
  int result = 1;
  cmListFileLexerDestroy(lexer);
  if (text) {
    int length = (int)strlen(text);
    lexer->string_buffer = (char*)malloc(length + 1);
    if (lexer->string_buffer) {
      strcpy(lexer->string_buffer, text);
      lexer->string_position = lexer->string_buffer;
      lexer->string_left = length;
    } else {
      result = 0;
    }
  }
  cmListFileLexerInit(lexer);
  return result;
}